

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O2

Trivia __thiscall
slang::parsing::Preprocessor::handleEndKeywordsDirective(Preprocessor *this,Token directive)

{
  pointer pKVar1;
  Info *pIVar2;
  undefined8 uVar3;
  Token directive_00;
  SourceRange range;
  Trivia TVar4;
  Token local_28;
  
  pIVar2 = directive.info;
  uVar3 = directive._0_8_;
  local_28._0_8_ = uVar3;
  local_28.info = pIVar2;
  checkOutsideDesignElement(this,directive);
  pKVar1 = (this->keywordVersionStack).
           super__Vector_base<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((long)pKVar1 -
      (long)(this->keywordVersionStack).
            super__Vector_base<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
            ._M_impl.super__Vector_impl_data._M_start == 1) {
    range = Token::range(&local_28);
    addDiag(this,(DiagCode)0x120004,range);
    pIVar2 = local_28.info;
    uVar3 = local_28._0_8_;
  }
  else {
    (this->keywordVersionStack).
    super__Vector_base<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
    ._M_impl.super__Vector_impl_data._M_finish = pKVar1 + -1;
  }
  directive_00.info = pIVar2;
  directive_00.kind = (TokenKind)uVar3;
  directive_00._2_1_ = SUB81(uVar3,2);
  directive_00.numFlags.raw = SUB81(uVar3,3);
  directive_00.rawLen = SUB84(uVar3,4);
  TVar4 = createSimpleDirective(this,directive_00);
  TVar4._8_8_ = TVar4._8_8_ & 0xffffffffffff;
  return TVar4;
}

Assistant:

Trivia Preprocessor::handleEndKeywordsDirective(Token directive) {
    checkOutsideDesignElement(directive);

    if (keywordVersionStack.size() == 1)
        addDiag(diag::MismatchedEndKeywordsDirective, directive.range());
    else
        keywordVersionStack.pop_back();

    return createSimpleDirective(directive);
}